

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O0

uint __thiscall
crnlib::dxt_image::get_block_colors
          (dxt_image *this,uint block_x,uint block_y,uint element_index,color_quad_u8 *pColors,
          uint subblock_index)

{
  char cVar1;
  int iVar2;
  bool bVar3;
  uint16 packed_delta3;
  uint16 uVar4;
  uint uVar5;
  uint uVar6;
  dxt1_block *this_00;
  etc1_block *this_01;
  uchar *puVar7;
  byte *pbVar8;
  uint local_9c;
  uint i_1;
  int comp_index_1;
  uint i;
  int comp_index;
  uint n;
  uint values [8];
  dxt5_block *block5;
  dxt1_block *block1;
  uint16 base_color4_0;
  uint16 base_color4_1;
  uint16 delta_color3;
  uint16 base_color5;
  uint table_index1;
  uint table_index0;
  etc1_block *src_block;
  element *block;
  uint subblock_index_local;
  color_quad_u8 *pColors_local;
  uint element_index_local;
  uint block_y_local;
  uint block_x_local;
  dxt_image *this_local;
  
  this_00 = (dxt1_block *)get_element(this,block_x,block_y,element_index);
  switch(this->m_element_type[element_index]) {
  case cColorDXT1:
    uVar5 = dxt1_block::get_low_color(this_00);
    uVar6 = dxt1_block::get_high_color(this_00);
    this_local._4_4_ = dxt1_block::get_block_colors(pColors,(uint16)uVar5,(uint16)uVar6);
    break;
  case cAlphaDXT3:
    cVar1 = this->m_element_component_index[element_index];
    for (local_9c = 0; local_9c < 0x10; local_9c = local_9c + 1) {
      pbVar8 = color_quad<unsigned_char,_int>::operator[](pColors + local_9c,(int)cVar1);
      *pbVar8 = (byte)(local_9c << 4) | (byte)local_9c;
    }
    this_local._4_4_ = 0x10;
    break;
  case cAlphaDXT5:
    values._24_8_ = this_00;
    uVar5 = dxt5_block::get_low_alpha((dxt5_block *)this_00);
    uVar6 = dxt5_block::get_high_alpha((dxt5_block *)values._24_8_);
    this_local._4_4_ = dxt5_block::get_block_values((uint *)&comp_index,uVar5,uVar6);
    cVar1 = this->m_element_component_index[element_index];
    for (i_1 = 0; i_1 < this_local._4_4_; i_1 = i_1 + 1) {
      iVar2 = (&comp_index)[i_1];
      puVar7 = color_quad<unsigned_char,_int>::operator[](pColors + i_1,(int)cVar1);
      *puVar7 = (uchar)iVar2;
    }
    break;
  case cColorETC1:
    this_01 = (etc1_block *)get_element(this,block_x,block_y,element_index);
    uVar5 = etc1_block::get_inten_table(this_01,0);
    uVar6 = etc1_block::get_inten_table(this_01,1);
    bVar3 = etc1_block::get_diff_bit(this_01);
    if (bVar3) {
      uVar4 = etc1_block::get_base5_color(this_01);
      packed_delta3 = etc1_block::get_delta3_color(this_01);
      if (subblock_index == 0) {
        etc1_block::get_diff_subblock_colors(pColors,uVar4,uVar5);
      }
      else {
        etc1_block::get_diff_subblock_colors(pColors,uVar4,packed_delta3,uVar6);
      }
    }
    else if (subblock_index == 0) {
      uVar4 = etc1_block::get_base4_color(this_01,0);
      etc1_block::get_abs_subblock_colors(pColors,uVar4,uVar5);
    }
    else {
      uVar4 = etc1_block::get_base4_color(this_01,1);
      etc1_block::get_abs_subblock_colors(pColors,uVar4,uVar6);
    }
  default:
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

uint dxt_image::get_block_colors(uint block_x, uint block_y, uint element_index, color_quad_u8* pColors, uint subblock_index)
    {
        const element& block = get_element(block_x, block_y, element_index);

        switch (m_element_type[element_index])
        {
        case cColorETC1:
        {
            const etc1_block& src_block = *reinterpret_cast<const etc1_block*>(&get_element(block_x, block_y, element_index));
            const uint table_index0 = src_block.get_inten_table(0);
            const uint table_index1 = src_block.get_inten_table(1);
            if (src_block.get_diff_bit())
            {
                const uint16 base_color5 = src_block.get_base5_color();
                const uint16 delta_color3 = src_block.get_delta3_color();
                if (subblock_index)
                {
                    etc1_block::get_diff_subblock_colors(pColors, base_color5, delta_color3, table_index1);
                }
                else
                {
                    etc1_block::get_diff_subblock_colors(pColors, base_color5, table_index0);
                }
            }
            else
            {
                if (subblock_index)
                {
                    const uint16 base_color4_1 = src_block.get_base4_color(1);
                    etc1_block::get_abs_subblock_colors(pColors, base_color4_1, table_index1);
                }
                else
                {
                    const uint16 base_color4_0 = src_block.get_base4_color(0);
                    etc1_block::get_abs_subblock_colors(pColors, base_color4_0, table_index0);
                }
            }

            break;
        }
        case cColorDXT1:
        {
            const dxt1_block& block1 = *reinterpret_cast<const dxt1_block*>(&block);
            return dxt1_block::get_block_colors(pColors, static_cast<uint16>(block1.get_low_color()), static_cast<uint16>(block1.get_high_color()));
        }
        case cAlphaDXT5:
        {
            const dxt5_block& block5 = *reinterpret_cast<const dxt5_block*>(&block);

            uint values[cDXT5SelectorValues];

            const uint n = dxt5_block::get_block_values(values, block5.get_low_alpha(), block5.get_high_alpha());

            const int comp_index = m_element_component_index[element_index];
            for (uint i = 0; i < n; i++)
            {
                pColors[i][comp_index] = static_cast<uint8>(values[i]);
            }

            return n;
        }
        case cAlphaDXT3:
        {
            const int comp_index = m_element_component_index[element_index];
            for (uint i = 0; i < 16; i++)
            {
                pColors[i][comp_index] = static_cast<uint8>((i << 4) | i);
            }

            return 16;
        }
        default:
            break;
        }

        return 0;
    }